

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(int32_t i,Nonnull<char_*> buffer)

{
  uint uVar1;
  uint64_t x;
  char *in_RSI;
  uint in_EDI;
  uint32_t u;
  uint64_t bottom;
  uint32_t mod08;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  uint64_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  uint32_t in_stack_ffffffffffffffd4;
  char *local_8;
  
  uVar2 = in_EDI;
  local_8 = in_RSI;
  if ((int)in_EDI < 0) {
    local_8 = in_RSI + 1;
    *in_RSI = '-';
    uVar2 = -in_EDI;
  }
  if (uVar2 < 10) {
    *local_8 = (char)uVar2 + '0';
    local_8 = local_8 + 1;
  }
  else if (uVar2 < 100000000) {
    x = anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffffd4);
    if (x == 0) {
      __assert_fail("bottom != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0xf4,
                    "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                   );
    }
    uVar1 = countr_zero<unsigned_long>(x);
    little_endian::Store64
              ((Nonnull<void_*>)CONCAT44(uVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8)
    ;
    local_8 = local_8 + (8 - (ulong)(uVar1 >> 3));
  }
  else {
    anon_unknown_0::PrepareEightDigits(uVar2 % 100000000);
    local_8 = anon_unknown_0::EncodeHundred(in_EDI,local_8);
    little_endian::Store64
              ((Nonnull<void_*>)CONCAT44(uVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8)
    ;
    local_8 = local_8 + 8;
  }
  *local_8 = '\0';
  return local_8;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int32_t i, absl::Nonnull<char*> buffer) {
  uint32_t u = static_cast<uint32_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU32(u, buffer);
  *buffer = '\0';
  return buffer;
}